

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateFlagInlineCacheCheck
          (Lowerer *this,Instr *instrLdSt,RegOpnd *opndType,RegOpnd *opndInlineCache,
          LabelInstr *labelNext)

{
  IndirOpnd *compareSrc2;
  
  compareSrc2 = IR::IndirOpnd::New(opndInlineCache,0x10,TyInt64,instrLdSt->m_func,false);
  InsertCompareBranch((Lowerer *)opndInlineCache,&opndType->super_Opnd,&compareSrc2->super_Opnd,
                      BrNeq_A,labelNext,instrLdSt,false);
  return;
}

Assistant:

void
Lowerer::GenerateFlagInlineCacheCheck(
    IR::Instr * instrLdSt,
    IR::RegOpnd * opndType,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelNext)
{
    // Generate:
    //
    //      CMP s1, [&(inlineCache->u.accessor.type)]
    //      JNE $next

    IR::Opnd* typeOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.type), TyMachReg, instrLdSt->m_func);

    // CMP s1, [&(inlineCache->u.flag.type)]
    InsertCompareBranch(opndType, typeOpnd, Js::OpCode::BrNeq_A, labelNext, instrLdSt);
}